

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O3

deUint32 __thiscall
vkt::pipeline::getNextMultiple
          (pipeline *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *divisors,
          deUint32 value)

{
  uint uVar1;
  deUint32 nextMultiple;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  uVar5 = (ulong)value;
  lVar7 = (long)divisors - (long)this >> 2;
  lVar7 = lVar7 + (ulong)(lVar7 == 0);
  do {
    if ((pipeline *)divisors == this) {
      return value;
    }
    dVar4 = (deUint32)uVar5;
    bVar8 = true;
    lVar6 = 0;
    do {
      while (!bVar8) {
        lVar6 = lVar6 + 1;
        bVar8 = false;
        if (lVar6 == lVar7) goto LAB_004a01df;
      }
      iVar2 = (int)(uVar5 % (ulong)*(uint *)(this + lVar6 * 4));
      bVar8 = iVar2 == 0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar7);
    if (iVar2 == 0) {
      return dVar4;
    }
LAB_004a01df:
    uVar3 = (dVar4 + 1) % *(uint *)this;
    uVar1 = (dVar4 + *(uint *)this + 1) - uVar3;
    if (uVar3 == 0) {
      uVar1 = dVar4 + 1;
    }
    uVar5 = (ulong)uVar1;
  } while( true );
}

Assistant:

static deUint32 getNextMultiple (const std::vector<deUint32>& divisors, deUint32 value)
{
	deUint32	nextMultiple		= value;
	bool		nextMultipleFound	= false;

	while (true)
	{
		nextMultipleFound = true;

		for (size_t divNdx = 0; divNdx < divisors.size(); divNdx++)
			nextMultipleFound = nextMultipleFound && (nextMultiple % divisors[divNdx] == 0);

		if (nextMultipleFound)
			break;

		DE_ASSERT(nextMultiple < ~((deUint32)0u));
		nextMultiple = getNextMultiple(divisors[0], nextMultiple + 1);
	}

	return nextMultiple;
}